

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void js_async_from_sync_iterator_mark(JSRuntime *rt,JSValue val,JS_MarkFunc *mark_func)

{
  JSValue val_00;
  JSValue val_01;
  JSValue obj;
  JS_MarkFunc *mark_func_00;
  JSRuntime *in_RCX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSValueUnion in_RDI;
  JSAsyncFromSyncIteratorData *s;
  
  obj.tag = in_RDX;
  obj.u.ptr = in_RSI.ptr;
  mark_func_00 = (JS_MarkFunc *)JS_GetOpaque(obj,0x30);
  if (mark_func_00 != (JS_MarkFunc *)0x0) {
    val_00.tag = (int64_t)in_RSI.ptr;
    val_00.u.ptr = in_RDI.ptr;
    JS_MarkValue(in_RCX,val_00,mark_func_00);
    val_01.tag = (int64_t)in_RSI.ptr;
    val_01.u.ptr = in_RDI.ptr;
    JS_MarkValue(in_RCX,val_01,mark_func_00);
  }
  return;
}

Assistant:

static void js_async_from_sync_iterator_mark(JSRuntime *rt, JSValueConst val,
                                             JS_MarkFunc *mark_func)
{
    JSAsyncFromSyncIteratorData *s =
        JS_GetOpaque(val, JS_CLASS_ASYNC_FROM_SYNC_ITERATOR);
    if (s) {
        JS_MarkValue(rt, s->sync_iter, mark_func);
        JS_MarkValue(rt, s->next_method, mark_func);
    }
}